

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float v;
  int iVar1;
  uint _c;
  size_t _elemsize;
  float *pfVar2;
  int _h;
  ulong uVar3;
  int _w;
  long lVar4;
  Mat borderm;
  Mat m;
  
  if (((this->top == 0 && this->bottom == 0) && this->left == 0) && this->right == 0) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    iVar1 = bottom_blob->dims;
    _elemsize = bottom_blob->elemsize;
    _w = this->right + this->left + bottom_blob->w;
    if (iVar1 == 1) {
      Mat::create(top_blob,_w,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_make_border_image<float>(bottom_blob,top_blob,0,this->left,this->type,this->value);
        return 0;
      }
      if (_elemsize != 2) {
        if (_elemsize != 1) {
          return 0;
        }
        copy_make_border_image<signed_char>
                  (bottom_blob,top_blob,0,this->left,this->type,(char)(int)this->value);
        return 0;
      }
      copy_make_border_image<unsigned_short>
                (bottom_blob,top_blob,0,this->left,this->type,
                 *(unsigned_short *)((long)&this->value + 2));
      return 0;
    }
    _h = this->bottom + this->top + bottom_blob->h;
    if (iVar1 == 3) {
      _c = bottom_blob->c;
      Mat::create(top_blob,_w,_h,_c,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if ((int)_c < 1) {
        _c = 0;
      }
      lVar4 = 0;
      for (uVar3 = 0; _c != uVar3; uVar3 = uVar3 + 1) {
        Mat::channel(&m,bottom_blob,(int)uVar3);
        Mat::channel(&borderm,top_blob,(int)uVar3);
        pfVar2 = (float *)((long)(this->per_channel_pad_data).data + lVar4);
        if (this->per_channel_pad_data_size == 0) {
          pfVar2 = &this->value;
        }
        v = *pfVar2;
        if (_elemsize == 4) {
          copy_make_border_image<float>(&m,&borderm,this->top,this->left,this->type,v);
        }
        else if (_elemsize == 2) {
          copy_make_border_image<unsigned_short>
                    (&m,&borderm,this->top,this->left,this->type,(unsigned_short)((uint)v >> 0x10));
        }
        else if (_elemsize == 1) {
          copy_make_border_image<signed_char>
                    (&m,&borderm,this->top,this->left,this->type,(char)(int)v);
        }
        Mat::~Mat(&borderm);
        Mat::~Mat(&m);
        lVar4 = lVar4 + 4;
      }
    }
    else if (iVar1 == 2) {
      Mat::create(top_blob,_w,_h,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_make_border_image<float>
                  (bottom_blob,top_blob,this->top,this->left,this->type,this->value);
      }
      else if (_elemsize == 2) {
        copy_make_border_image<unsigned_short>
                  (bottom_blob,top_blob,this->top,this->left,this->type,
                   *(unsigned_short *)((long)&this->value + 2));
      }
      else if (_elemsize == 1) {
        copy_make_border_image<signed_char>
                  (bottom_blob,top_blob,this->top,this->left,this->type,(char)(int)this->value);
      }
    }
  }
  return 0;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, 0, left, type, float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, top, left, type, float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob.channel(q);
            Mat borderm = top_blob.channel(q);

            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            if (elemsize == 1)
                copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
            if (elemsize == 2)
                copy_make_border_image<unsigned short>(m, borderm, top, left, type, float32_to_bfloat16(pad_value));
            if (elemsize == 4)
                copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
        }

        return 0;
    }

    return 0;
}